

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindGateGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
              Vec_Int_t *vUnatePairsW,word *pDivTempA,word *pDivTempB)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int ComplA;
  int iVar4;
  int ComplB;
  uint uVar5;
  int fCompB;
  int fCompA;
  int nTotal;
  int Cover1;
  int Cover0;
  int iDiv1;
  int iDiv0;
  int k;
  int i;
  Vec_Int_t *vUnatePairsW_local;
  Vec_Int_t *vUnatePairs_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word *pOn_local;
  word *pOff_local;
  
  iVar1 = Abc_TtCountOnesVec(pOn,nWords);
  iDiv1 = 0;
  do {
    iVar2 = Vec_IntSize(vUnatePairs);
    if (iVar2 <= iDiv1) {
      return -1;
    }
    iVar2 = Vec_IntEntry(vUnatePairs,iDiv1);
    iVar3 = Vec_IntEntry(vUnatePairsW,iDiv1);
    ComplA = Abc_LitIsCompl(iVar2);
    if (iVar3 * 2 < iVar1) {
      return -1;
    }
    Gia_ManDeriveDivPair(iVar2,vDivs,nWords,pDivTempA);
    iDiv0 = iDiv1;
    while( true ) {
      iDiv0 = iDiv0 + 1;
      iVar2 = Vec_IntSize(vUnatePairs);
      if (iVar2 <= iDiv0) break;
      iVar2 = Vec_IntEntry(vUnatePairs,iDiv0);
      iVar4 = Vec_IntEntry(vUnatePairsW,iDiv0);
      ComplB = Abc_LitIsCompl(iVar2);
      if (iVar3 + iVar4 < iVar1) break;
      Gia_ManDeriveDivPair(iVar2,vDivs,nWords,pDivTempB);
      iVar2 = Gia_ManDivCover(pOff,pOn,pDivTempA,ComplA,pDivTempB,ComplB,nWords);
      if (iVar2 != 0) {
        iVar1 = Abc_Var2Lit(iDiv0,1);
        uVar5 = Abc_Var2Lit(iDiv1,1);
        iVar1 = Abc_Var2Lit(iVar1 << 0xf | uVar5,1);
        return iVar1;
      }
    }
    iDiv1 = iDiv1 + 1;
  } while( true );
}

Assistant:

int Gia_ManFindGateGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, word * pDivTempA, word * pDivTempB )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv0, Cover0, k )
    {
        int fCompA = Abc_LitIsCompl(iDiv0);
        if ( 2*Cover0 < nTotal )
            break;
        Gia_ManDeriveDivPair( iDiv0, vDivs, nWords, pDivTempA );
        Vec_IntForEachEntryTwoStart( vUnatePairs, vUnatePairsW, iDiv1, Cover1, i, k+1 )
        {
            int fCompB = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTempB );
            if ( Gia_ManDivCover(pOff, pOn, pDivTempA, fCompA, pDivTempB, fCompB, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(i, 1) << 15) | Abc_Var2Lit(k, 1), 1);
        }
    }
    return -1;
}